

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::cmGeneratorTarget(cmGeneratorTarget *this,cmTarget *t,cmLocalGenerator *lg)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  cmMakefile *pcVar4;
  cmGlobalGenerator *pcVar5;
  bool local_30a;
  allocator local_141;
  string local_140;
  byte local_11b;
  byte local_11a;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  cmBacktraceRange local_d0;
  cmStringRange local_c0;
  cmBacktraceRange local_b0;
  cmStringRange local_a0;
  cmBacktraceRange local_90;
  cmStringRange local_80;
  cmBacktraceRange local_70;
  cmStringRange local_60;
  cmBacktraceRange local_50;
  cmStringRange local_40;
  cmLocalGenerator *local_20;
  cmLocalGenerator *lg_local;
  cmTarget *t_local;
  cmGeneratorTarget *this_local;
  
  this->Target = t;
  local_20 = lg;
  lg_local = (cmLocalGenerator *)t;
  t_local = (cmTarget *)this;
  std::__cxx11::string::string((string *)&this->ObjectDirectory);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
  ::map(&this->CompileInfoMap);
  this->FortranModuleDirectoryCreated = false;
  std::__cxx11::string::string((string *)&this->FortranModuleDirectory);
  std::
  map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
  ::map(&this->SourceDepends);
  std::
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->Objects);
  std::
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::set(&this->ExplicitObjectName);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->SystemIncludesCache);
  std::__cxx11::string::string((string *)&this->ExportMacro);
  this->SourceFileFlagsConstructed = false;
  std::
  map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
  ::map(&this->SourceFlagsMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map(&this->DebugCompatiblePropertiesDone);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkClosure>_>_>
  ::map(&this->LinkClosureMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces>_>_>
  ::map(&this->CompatibleInterfacesMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation_*>_>_>
  ::map(&this->LinkInformation);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure>_>_>
  ::map(&this->LinkImplClosureMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap>_>_>
  ::map(&this->LinkInterfaceMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap>_>_>
  ::map(&this->LinkInterfaceUsageRequirementsOnlyMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
  ::map(&this->ImportInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
  ::map(&this->KindedSourcesMap);
  std::
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>::
  vector(&this->AllConfigSources);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::vector(&this->IncludeDirectoriesEntries);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::vector(&this->CompileOptionsEntries);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::vector(&this->CompileFeaturesEntries);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::vector(&this->CompileDefinitionsEntries);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::vector(&this->SourceEntries);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->LinkImplicitNullProperties);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
  ::map(&this->LinkImplMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
  ::map(&this->OutputInfoMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>_>
  ::map(&this->ModuleDefinitionInfoMap);
  std::
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->OutputNameMap);
  std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::set(&this->UtilityItems)
  ;
  cmPolicies::PolicyMap::PolicyMap(&this->PolicyMap);
  this->PolicyWarnedCMP0022 = false;
  this->PolicyReportedCMP0069 = false;
  this->DebugIncludesDone = false;
  this->DebugCompileOptionsDone = false;
  this->DebugCompileFeaturesDone = false;
  this->DebugCompileDefinitionsDone = false;
  this->DebugSourcesDone = false;
  this->LinkImplementationLanguageIsContextDependent = true;
  this->UtilityItemsDone = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->MaxLanguageStandards);
  pcVar4 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar4;
  this->LocalGenerator = local_20;
  pcVar5 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  this->GlobalGenerator = pcVar5;
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  local_40 = cmTarget::GetIncludeDirectoriesEntries_abi_cxx11_((cmTarget *)lg_local);
  local_50 = cmTarget::GetIncludeDirectoriesBacktraces((cmTarget *)lg_local);
  CreatePropertyGeneratorExpressions(local_40,local_50,&this->IncludeDirectoriesEntries,false);
  local_60 = cmTarget::GetCompileOptionsEntries_abi_cxx11_((cmTarget *)lg_local);
  local_70 = cmTarget::GetCompileOptionsBacktraces((cmTarget *)lg_local);
  CreatePropertyGeneratorExpressions(local_60,local_70,&this->CompileOptionsEntries,false);
  local_80 = cmTarget::GetCompileFeaturesEntries_abi_cxx11_((cmTarget *)lg_local);
  local_90 = cmTarget::GetCompileFeaturesBacktraces((cmTarget *)lg_local);
  CreatePropertyGeneratorExpressions(local_80,local_90,&this->CompileFeaturesEntries,false);
  local_a0 = cmTarget::GetCompileDefinitionsEntries_abi_cxx11_((cmTarget *)lg_local);
  local_b0 = cmTarget::GetCompileDefinitionsBacktraces((cmTarget *)lg_local);
  CreatePropertyGeneratorExpressions(local_a0,local_b0,&this->CompileDefinitionsEntries,false);
  local_c0 = cmTarget::GetSourceEntries_abi_cxx11_((cmTarget *)lg_local);
  local_d0 = cmTarget::GetSourceBacktraces((cmTarget *)lg_local);
  CreatePropertyGeneratorExpressions(local_c0,local_d0,&this->SourceEntries,true);
  pcVar4 = this->Makefile;
  std::allocator<char>::allocator();
  local_11a = 0;
  local_11b = 0;
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string((string *)&local_f0,"WIN32",&local_f1);
  bVar3 = cmMakefile::IsOn(pcVar4,&local_f0);
  local_30a = true;
  if (!bVar3) {
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    local_11a = 1;
    std::__cxx11::string::string((string *)&local_118,"CYGWIN",&local_119);
    local_11b = 1;
    bVar3 = cmMakefile::IsOn(pcVar4,&local_118);
    local_30a = true;
    if (!bVar3) {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string((string *)&local_140,"MINGW",&local_141);
      bVar1 = true;
      local_30a = cmMakefile::IsOn(pcVar4,&local_140);
    }
  }
  this->DLLPlatform = local_30a;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  if ((local_11b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_118);
  }
  if ((local_11a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] =
       (_WordT)(lg_local->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] =
       (_WordT)(lg_local->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] =
       (lg_local->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] =
       (_WordT)(lg_local->GeneratorTargets).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
  return;
}

Assistant:

cmGeneratorTarget::cmGeneratorTarget(cmTarget* t, cmLocalGenerator* lg)
  : Target(t)
  , FortranModuleDirectoryCreated(false)
  , SourceFileFlagsConstructed(false)
  , PolicyWarnedCMP0022(false)
  , PolicyReportedCMP0069(false)
  , DebugIncludesDone(false)
  , DebugCompileOptionsDone(false)
  , DebugCompileFeaturesDone(false)
  , DebugCompileDefinitionsDone(false)
  , DebugSourcesDone(false)
  , LinkImplementationLanguageIsContextDependent(true)
  , UtilityItemsDone(false)
{
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator = lg;
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();

  this->GlobalGenerator->ComputeTargetObjectDirectory(this);

  CreatePropertyGeneratorExpressions(t->GetIncludeDirectoriesEntries(),
                                     t->GetIncludeDirectoriesBacktraces(),
                                     this->IncludeDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileOptionsEntries(),
                                     t->GetCompileOptionsBacktraces(),
                                     this->CompileOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileFeaturesEntries(),
                                     t->GetCompileFeaturesBacktraces(),
                                     this->CompileFeaturesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileDefinitionsEntries(),
                                     t->GetCompileDefinitionsBacktraces(),
                                     this->CompileDefinitionsEntries);

  CreatePropertyGeneratorExpressions(t->GetSourceEntries(),
                                     t->GetSourceBacktraces(),
                                     this->SourceEntries, true);

  this->DLLPlatform =
    (this->Makefile->IsOn("WIN32") || this->Makefile->IsOn("CYGWIN") ||
     this->Makefile->IsOn("MINGW"));

  this->PolicyMap = t->PolicyMap;
}